

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool cmDependsFortran::ModulesDiffer(string *modFile,string *stampFile,string *compilerId)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  ostream *poVar4;
  char local_46a [2];
  int seqlen_1;
  char seq_1 [2];
  int seqlen;
  char seq [1];
  __mbstate_t local_458;
  char local_44a;
  char local_449;
  undefined4 local_448;
  bool okay;
  uchar hdr [2];
  long local_438;
  ifstream finStampFile;
  long local_230;
  ifstream finModFile;
  string *compilerId_local;
  string *stampFile_local;
  string *modFile_local;
  
  bVar1 = std::operator==(compilerId,"SunPro");
  if (bVar1) {
    bVar1 = cmsys::SystemTools::FilesDiffer(modFile,stampFile);
    return bVar1;
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_230,pcVar3,_S_in);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(&local_438,pcVar3,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  if (((bVar2 & 1) != 0) ||
     (bVar2 = std::ios::operator!((ios *)((long)&local_438 + *(long *)(local_438 + -0x18))),
     (bVar2 & 1) != 0)) {
    modFile_local._7_1_ = true;
    goto LAB_005a9f55;
  }
  bVar1 = std::operator==(compilerId,"GNU");
  if (bVar1) {
    std::istream::read((char *)&local_230,(long)&local_44a);
    bVar2 = std::ios::fail();
    std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&seqlen,0);
    std::istream::seekg(&local_230,_seqlen,local_458);
    if ((((~bVar2 & 1) == 0) || (local_44a != '\x1f')) || (local_449 != -0x75)) {
      seq_1[1] = '\n';
      seqlen_1 = 1;
      bVar1 = cmFortranStreamContainsSequence((istream *)&local_230,seq_1 + 1,1);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)compilerId);
        poVar4 = std::operator<<(poVar4," fortran module ");
        poVar4 = std::operator<<(poVar4,(string *)modFile);
        poVar4 = std::operator<<(poVar4," has unexpected format.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        modFile_local._7_1_ = true;
        goto LAB_005a9f55;
      }
      bVar1 = cmFortranStreamContainsSequence((istream *)&local_438,seq_1 + 1,1);
      if (!bVar1) {
        modFile_local._7_1_ = true;
        goto LAB_005a9f55;
      }
    }
  }
  else {
    bVar1 = std::operator==(compilerId,"Intel");
    if (bVar1) {
      local_46a[0] = '\n';
      local_46a[1] = '\0';
      std::istream::get();
      std::istream::get();
      bVar1 = cmFortranStreamContainsSequence((istream *)&local_230,local_46a,2);
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cerr,(string *)compilerId);
        poVar4 = std::operator<<(poVar4," fortran module ");
        poVar4 = std::operator<<(poVar4,(string *)modFile);
        poVar4 = std::operator<<(poVar4," has unexpected format.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        modFile_local._7_1_ = true;
        goto LAB_005a9f55;
      }
      bVar1 = cmFortranStreamContainsSequence((istream *)&local_438,local_46a,2);
      if (!bVar1) {
        modFile_local._7_1_ = true;
        goto LAB_005a9f55;
      }
    }
  }
  modFile_local._7_1_ = cmFortranStreamsDiffer((istream *)&local_230,(istream *)&local_438);
LAB_005a9f55:
  local_448 = 1;
  std::ifstream::~ifstream(&local_438);
  std::ifstream::~ifstream(&local_230);
  return modFile_local._7_1_;
}

Assistant:

bool cmDependsFortran::ModulesDiffer(const std::string& modFile,
                                     const std::string& stampFile,
                                     const std::string& compilerId)
{
  /*
  gnu >= 4.9:
    A mod file is an ascii file compressed with gzip.
    Compiling twice produces identical modules.

  gnu < 4.9:
    A mod file is an ascii file.
    <bar.mod>
    FORTRAN module created from /path/to/foo.f90 on Sun Dec 30 22:47:58 2007
    If you edit this, you'll get what you deserve.
    ...
    </bar.mod>
    As you can see the first line contains the date.

  intel:
    A mod file is a binary file.
    However, looking into both generated bar.mod files with a hex editor
    shows that they differ only before a sequence linefeed-zero (0x0A 0x00)
    which is located some bytes in front of the absolute path to the source
    file.

  sun:
    A mod file is a binary file.  Compiling twice produces identical modules.

  others:
    TODO ...
  */

  /* Compilers which do _not_ produce different mod content when the same
   * source is compiled twice
   *   -SunPro
   */
  if (compilerId == "SunPro") {
    return cmSystemTools::FilesDiffer(modFile, stampFile);
  }

#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream finModFile(modFile.c_str(), std::ios::in | std::ios::binary);
  cmsys::ifstream finStampFile(stampFile.c_str(),
                               std::ios::in | std::ios::binary);
#else
  cmsys::ifstream finModFile(modFile.c_str());
  cmsys::ifstream finStampFile(stampFile.c_str());
#endif
  if (!finModFile || !finStampFile) {
    // At least one of the files does not exist.  The modules differ.
    return true;
  }

  /* Compilers which _do_ produce different mod content when the same
   * source is compiled twice
   *   -GNU
   *   -Intel
   *
   * Eat the stream content until all recompile only related changes
   * are left behind.
   */
  if (compilerId == "GNU") {
    // GNU Fortran 4.9 and later compress .mod files with gzip
    // but also do not include a date so we can fall through to
    // compare them without skipping any prefix.
    unsigned char hdr[2];
    bool okay = !finModFile.read(reinterpret_cast<char*>(hdr), 2).fail();
    finModFile.seekg(0);
    if (!okay || hdr[0] != 0x1f || hdr[1] != 0x8b) {
      const char seq[1] = { '\n' };
      const int seqlen = 1;

      if (!cmFortranStreamContainsSequence(finModFile, seq, seqlen)) {
        // The module is of unexpected format.  Assume it is different.
        std::cerr << compilerId << " fortran module " << modFile
                  << " has unexpected format." << std::endl;
        return true;
      }

      if (!cmFortranStreamContainsSequence(finStampFile, seq, seqlen)) {
        // The stamp must differ if the sequence is not contained.
        return true;
      }
    }
  } else if (compilerId == "Intel") {
    const char seq[2] = { '\n', '\0' };
    const int seqlen = 2;

    // Skip the leading byte which appears to be a version number.
    // We do not need to check for an error because the sequence search
    // below will fail in that case.
    finModFile.get();
    finStampFile.get();

    if (!cmFortranStreamContainsSequence(finModFile, seq, seqlen)) {
      // The module is of unexpected format.  Assume it is different.
      std::cerr << compilerId << " fortran module " << modFile
                << " has unexpected format." << std::endl;
      return true;
    }

    if (!cmFortranStreamContainsSequence(finStampFile, seq, seqlen)) {
      // The stamp must differ if the sequence is not contained.
      return true;
    }
  }

  // Compare the remaining content.  If no compiler id matched above,
  // including the case none was given, this will compare the whole
  // content.
  return cmFortranStreamsDiffer(finModFile, finStampFile);
}